

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialAlgebraOperators.h
# Opt level: O0

SpatialMatrix * __thiscall
RigidBodyDynamics::Math::SpatialRigidBodyInertia::toMatrix(SpatialRigidBodyInertia *this)

{
  Scalar SVar1;
  Scalar *pSVar2;
  double *in_RSI;
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *in_RDI;
  SpatialMatrix *result;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *other;
  DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1> *in_stack_fffffffffffffe40;
  DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1> *this_00;
  Scalar startRow;
  DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *this_01;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *this_02;
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *this_03;
  Vector3d *in_stack_fffffffffffffea0;
  
  this_03 = in_RDI;
  SpatialMatrix_t::SpatialMatrix_t((SpatialMatrix_t *)0x6bcb26);
  other = (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_RSI[4];
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (in_stack_fffffffffffffe40,(Index)other,0x6bcb46);
  *pSVar2 = (Scalar)other;
  this_00 = (DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1> *)in_RSI[5];
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)other,0x6bcb75);
  *pSVar2 = (Scalar)this_00;
  startRow = in_RSI[7];
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)other,0x6bcba5);
  *pSVar2 = startRow;
  this_01 = (DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)in_RSI[5];
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)other,0x6bcbd5);
  *pSVar2 = (Scalar)this_01;
  this_02 = (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_RSI[6];
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)other,0x6bcc04);
  *pSVar2 = (Scalar)this_02;
  SVar1 = in_RSI[8];
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)other,0x6bcc35);
  *pSVar2 = SVar1;
  SVar1 = in_RSI[7];
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)other,0x6bcc65);
  *pSVar2 = SVar1;
  SVar1 = in_RSI[8];
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)other,0x6bcc96);
  *pSVar2 = SVar1;
  SVar1 = in_RSI[9];
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)other,0x6bccc5);
  *pSVar2 = SVar1;
  VectorCrossMatrix(in_stack_fffffffffffffea0);
  Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::block<3,3>
            (this_01,(Index)startRow,(Index)this_00);
  Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,3,3,false>::operator=
            ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false> *)this_00,other);
  VectorCrossMatrix(in_stack_fffffffffffffea0);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator-(this_02);
  Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::block<3,3>
            (this_01,(Index)startRow,(Index)this_00);
  Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,3,3,false>::operator=
            ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false> *)this_00,
             (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)other);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
  ::operator*(this_03,in_RSI);
  Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::block<3,3>
            (this_01,(Index)startRow,(Index)this_00);
  Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,3,3,false>::operator=
            ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false> *)this_00,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
              *)other);
  return (SpatialMatrix *)in_RDI;
}

Assistant:

SpatialMatrix toMatrix() const {
    SpatialMatrix result;
    result(0,0) = Ixx; result(0,1) = Iyx; result(0,2) = Izx;
    result(1,0) = Iyx; result(1,1) = Iyy; result(1,2) = Izy;
    result(2,0) = Izx; result(2,1) = Izy; result(2,2) = Izz;

    result.block<3,3>(0,3) = VectorCrossMatrix(h);
    result.block<3,3>(3,0) = - VectorCrossMatrix(h);
    result.block<3,3>(3,3) = Matrix3d::Identity() * m;

    return result;
  }